

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryUnorderedTypeHandler.cpp
# Opt level: O0

bool __thiscall
Js::SimpleDictionaryUnorderedTypeHandler<unsigned_short,_Js::JavascriptString_*,_true>::
TryReuseDeletedPropertyIndex
          (SimpleDictionaryUnorderedTypeHandler<unsigned_short,_Js::JavascriptString_*,_true> *this,
          DynamicObject *object,unsigned_short *propertyIndex)

{
  code *pcVar1;
  bool bVar2;
  int32 iVar3;
  undefined4 *puVar4;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *pBVar5;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *pSVar6;
  Var aValue;
  unsigned_short *propertyIndex_local;
  DynamicObject *object_local;
  SimpleDictionaryUnorderedTypeHandler<unsigned_short,_Js::JavascriptString_*,_true> *this_local;
  
  if (object == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryUnorderedTypeHandler.cpp"
                                ,0x46,"(object)","object");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (propertyIndex == (unsigned_short *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryUnorderedTypeHandler.cpp"
                                ,0x47,"(propertyIndex)","propertyIndex");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (*(short *)&(this->
                 super_SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>
                 ).field_0x2c == -1) {
    this_local._7_1_ = false;
  }
  else {
    pBVar5 = Memory::
             WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
             ::operator->(&(this->
                           super_SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>
                           ).propertyMap);
    pSVar6 = JsUtil::
             BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
             ::GetValueAt(pBVar5,(uint)*(ushort *)
                                        &(this->
                                         super_SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>
                                         ).field_0x2c);
    if (pSVar6->propertyIndex !=
        *(unsigned_short *)
         &(this->super_SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>
          ).field_0x2c) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryUnorderedTypeHandler.cpp"
                                  ,0x4e,
                                  "(this->propertyMap->GetValueAt(deletedPropertyIndex).propertyIndex == deletedPropertyIndex)"
                                  ,
                                  "this->propertyMap->GetValueAt(deletedPropertyIndex).propertyIndex == deletedPropertyIndex"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pBVar5 = Memory::
             WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
             ::operator->(&(this->
                           super_SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>
                           ).propertyMap);
    pSVar6 = JsUtil::
             BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
             ::GetValueAt(pBVar5,(uint)*(ushort *)
                                        &(this->
                                         super_SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>
                                         ).field_0x2c);
    if ((pSVar6->Attributes & 8) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryUnorderedTypeHandler.cpp"
                                  ,0x4f,
                                  "(this->propertyMap->GetValueAt(deletedPropertyIndex).Attributes & 0x08)"
                                  ,
                                  "this->propertyMap->GetValueAt(deletedPropertyIndex).Attributes & PropertyDeleted"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    *propertyIndex =
         *(unsigned_short *)
          &(this->
           super_SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>).
           field_0x2c;
    aValue = DynamicObject::GetSlot
                       (object,(uint)*(ushort *)
                                      &(this->
                                       super_SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>
                                       ).field_0x2c);
    iVar3 = TaggedInt::ToInt32(aValue);
    *(short *)&(this->
               super_SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>).
               field_0x2c = (short)iVar3;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SimpleDictionaryUnorderedTypeHandler<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::TryReuseDeletedPropertyIndex(
        DynamicObject *const object,
        TPropertyIndex *const propertyIndex)
    {
        Assert(object);
        Assert(propertyIndex);

        if(deletedPropertyIndex == PropertyIndexRanges<TPropertyIndex>::NoSlots)
        {
            return false;
        }

        Assert(this->propertyMap->GetValueAt(deletedPropertyIndex).propertyIndex == deletedPropertyIndex);
        Assert(this->propertyMap->GetValueAt(deletedPropertyIndex).Attributes & PropertyDeleted);

        *propertyIndex = deletedPropertyIndex;
        deletedPropertyIndex = static_cast<TPropertyIndex>(TaggedInt::ToInt32(object->GetSlot(deletedPropertyIndex)));
        return true;
    }